

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

DispatchCallResult __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *actualInterfaceName,uint64_t requestedTypeId)

{
  undefined8 extraout_RDX;
  unsigned_long *in_R9;
  DispatchCallResult DVar1;
  Array<char> local_1d0;
  uint64_t requestedTypeId_local;
  char *actualInterfaceName_local;
  Exception local_1a8;
  
  actualInterfaceName_local = (char *)requestedTypeId;
  kj::_::Debug::makeDescription<char_const(&)[37],char_const*&,unsigned_long&>
            ((String *)&local_1d0,
             (Debug *)
             "\"Requested interface not implemented.\", actualInterfaceName, requestedTypeId",
             "Requested interface not implemented.",(char (*) [37])&actualInterfaceName_local,
             (char **)&requestedTypeId_local,in_R9);
  kj::Exception::Exception
            (&local_1a8,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x5c,(String *)&local_1d0);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_1a8);
  *(undefined2 *)&(this->thisHook).ptr = 0x100;
  kj::Exception::~Exception(&local_1a8);
  kj::Array<char>::~Array(&local_1d0);
  DVar1.isStreaming = (bool)(char)extraout_RDX;
  DVar1.allowCancellation = (bool)(char)((ulong)extraout_RDX >> 8);
  DVar1._10_6_ = (int6)((ulong)extraout_RDX >> 0x10);
  DVar1.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar1;
}

Assistant:

Capability::Server::DispatchCallResult Capability::Server::internalUnimplemented(
    const char* actualInterfaceName, uint64_t requestedTypeId) {
  return {
    KJ_EXCEPTION(UNIMPLEMENTED, "Requested interface not implemented.",
                 actualInterfaceName, requestedTypeId),
    false, true
  };
}